

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.c
# Opt level: O0

IXML_Element * ixmlDocument_getElementById(IXML_Document *doc,char *tagName)

{
  unsigned_short uVar1;
  int iVar2;
  char *__s2;
  IXML_Node *pIVar3;
  char *name;
  IXML_Node *nodeptr;
  IXML_Element *rtElement;
  char *tagName_local;
  IXML_Document *doc_local;
  
  if ((doc == (IXML_Document *)0x0) || (tagName == (char *)0x0)) {
    return (IXML_Element *)0x0;
  }
  uVar1 = ixmlNode_getNodeType(&doc->n);
  if (uVar1 == 1) {
    __s2 = ixmlNode_getNodeName(&doc->n);
    if (__s2 == (char *)0x0) {
      return (IXML_Element *)0x0;
    }
    iVar2 = strcmp(tagName,__s2);
    if (iVar2 == 0) {
      return (IXML_Element *)doc;
    }
    pIVar3 = ixmlNode_getFirstChild(&doc->n);
    nodeptr = &ixmlDocument_getElementById((IXML_Document *)pIVar3,tagName)->n;
    if ((IXML_Element *)nodeptr == (IXML_Element *)0x0) {
      pIVar3 = ixmlNode_getNextSibling(&doc->n);
      nodeptr = &ixmlDocument_getElementById((IXML_Document *)pIVar3,tagName)->n;
    }
  }
  else {
    pIVar3 = ixmlNode_getFirstChild(&doc->n);
    nodeptr = &ixmlDocument_getElementById((IXML_Document *)pIVar3,tagName)->n;
    if ((IXML_Element *)nodeptr == (IXML_Element *)0x0) {
      pIVar3 = ixmlNode_getNextSibling(&doc->n);
      nodeptr = &ixmlDocument_getElementById((IXML_Document *)pIVar3,tagName)->n;
    }
  }
  return (IXML_Element *)nodeptr;
}

Assistant:

IXML_Element *ixmlDocument_getElementById(
	IXML_Document *doc, const DOMString tagName)
{
	IXML_Element *rtElement = NULL;
	IXML_Node *nodeptr = (IXML_Node *)doc;
	const char *name;

	if (nodeptr == NULL || tagName == NULL) {
		return rtElement;
	}

	if (ixmlNode_getNodeType(nodeptr) == eELEMENT_NODE) {
		name = ixmlNode_getNodeName(nodeptr);
		if (name == NULL) {
			return rtElement;
		}

		if (strcmp(tagName, name) == 0) {
			rtElement = (IXML_Element *)nodeptr;
			return rtElement;
		} else {
			rtElement = ixmlDocument_getElementById(
				(IXML_Document *)ixmlNode_getFirstChild(
					nodeptr),
				tagName);
			if (rtElement == NULL) {
				rtElement = ixmlDocument_getElementById(
					(IXML_Document *)
						ixmlNode_getNextSibling(
							nodeptr),
					tagName);
			}
		}
	} else {
		rtElement = ixmlDocument_getElementById(
			(IXML_Document *)ixmlNode_getFirstChild(nodeptr),
			tagName);
		if (rtElement == NULL) {
			rtElement = ixmlDocument_getElementById(
				(IXML_Document *)ixmlNode_getNextSibling(
					nodeptr),
				tagName);
		}
	}

	return rtElement;
}